

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O1

void __thiscall QLayout::QLayout(QLayout *this,QLayoutPrivate *dd,QLayout *lay,QWidget *w)

{
  byte *pbVar1;
  long lVar2;
  QLayout *pQVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  QWidget *pQVar7;
  long in_FS_OFFSET;
  QArrayData *local_88;
  QArrayData *local_70;
  char local_58 [24];
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = (QWidget *)lay;
  if (lay == (QLayout *)0x0) {
    pQVar7 = w;
  }
  QObject::QObject(&this->super_QObject,&dd->super_QObjectPrivate,&pQVar7->super_QObject);
  (this->super_QLayoutItem).align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
  super_QFlagsStorage<Qt::AlignmentFlag>.i = 0;
  *(undefined ***)this = &PTR_metaObject_007f4aa0;
  (this->super_QLayoutItem)._vptr_QLayoutItem = (_func_int **)&PTR__QLayout_007f4ba0;
  if (lay == (QLayout *)0x0) {
    if (w != (QWidget *)0x0) {
      lVar2 = *(long *)&this->field_0x8;
      pQVar3 = QWidget::layout(w);
      if (pQVar3 == (QLayout *)0x0) {
        pbVar1 = (byte *)(lVar2 + 0x8c);
        *pbVar1 = *pbVar1 | 1;
        *(QLayout **)(*(long *)&w->field_0x8 + 0x98) = this;
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          (**(code **)(*(long *)this + 0x70))(this);
          return;
        }
        goto LAB_002eaa42;
      }
      local_58[0] = '\x02';
      local_58[1] = '\0';
      local_58[2] = '\0';
      local_58[3] = '\0';
      local_58[4] = '\0';
      local_58[5] = '\0';
      local_58[6] = '\0';
      local_58[7] = '\0';
      local_58[8] = '\0';
      local_58[9] = '\0';
      local_58[10] = '\0';
      local_58[0xb] = '\0';
      local_58[0xc] = '\0';
      local_58[0xd] = '\0';
      local_58[0xe] = '\0';
      local_58[0xf] = '\0';
      local_58[0x10] = '\0';
      local_58[0x11] = '\0';
      local_58[0x12] = '\0';
      local_58[0x13] = '\0';
      local_58[0x14] = '\0';
      local_58[0x15] = '\0';
      local_58[0x16] = '\0';
      local_58[0x17] = '\0';
      local_40 = "default";
      QObject::objectName();
      uVar4 = QString::utf16();
      (*(code *)**(undefined8 **)w)(w);
      uVar5 = QMetaObject::className();
      QObject::objectName();
      uVar6 = QString::utf16();
      QMessageLogger::warning
                (local_58,
                 "QLayout: Attempting to add QLayout \"%ls\" to %s \"%ls\", which already has a layout"
                 ,uVar4,uVar5,uVar6);
      if (local_88 != (QArrayData *)0x0) {
        LOCK();
        (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_88,2,0x10);
        }
      }
      if (local_70 != (QArrayData *)0x0) {
        LOCK();
        (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_70,2,0x10);
        }
      }
      QObject::setParent(&this->super_QObject);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    (**(code **)(*(long *)lay + 0x80))(lay,&this->super_QLayoutItem);
    return;
  }
LAB_002eaa42:
  __stack_chk_fail();
}

Assistant:

QLayout::QLayout(QLayoutPrivate &dd, QLayout *lay, QWidget *w)
    : QObject(dd, lay ? static_cast<QObject*>(lay) : static_cast<QObject*>(w))
{
    Q_D(QLayout);
    if (lay) {
        lay->addItem(this);
    } else if (w) {
        if (Q_UNLIKELY(w->layout())) {
            qWarning("QLayout: Attempting to add QLayout \"%ls\" to %s \"%ls\", which"
                     " already has a layout",
                     qUtf16Printable(QObject::objectName()), w->metaObject()->className(),
                     qUtf16Printable(w->objectName()));
            setParent(nullptr);
        } else {
            d->topLevel = true;
            w->d_func()->layout = this;
            QT_TRY {
                invalidate();
            } QT_CATCH(...) {
                w->d_func()->layout = nullptr;
                QT_RETHROW;
            }
        }
    }